

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O1

AUTHENTICATION_HANDLE authentication_create(AUTHENTICATION_CONFIG *config)

{
  IOTHUB_AUTHORIZATION_HANDLE handle;
  AUTHENTICATION_HANDLE authentication_handle;
  char *pcVar1;
  STRING_HANDLE pSVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  AUTHENTICATION_HANDLE pAVar5;
  
  if (config == (AUTHENTICATION_CONFIG *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar1 = "authentication_create failed (config is NULL)";
    iVar4 = 0x1d1;
LAB_0013372b:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
              ,"authentication_create",iVar4,1,pcVar1);
    return (AUTHENTICATION_HANDLE)0x0;
  }
  handle = config->authorization_module;
  if (handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar1 = "authentication_create failed (config->authorization_module is NULL)";
    iVar4 = 0x1d6;
    goto LAB_0013372b;
  }
  if (config->iothub_host_fqdn == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar1 = "authentication_create failed (config->iothub_host_fqdn is NULL)";
    iVar4 = 0x1db;
    goto LAB_0013372b;
  }
  if (config->on_state_changed_callback == (ON_AUTHENTICATION_STATE_CHANGED_CALLBACK)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar1 = "authentication_create failed (config->on_state_changed_callback is NULL)";
    iVar4 = 0x1e0;
    goto LAB_0013372b;
  }
  authentication_handle = (AUTHENTICATION_HANDLE)malloc(0x70);
  if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (AUTHENTICATION_HANDLE)0x0;
    }
    pcVar1 = "authentication_create failed (malloc failed)";
    iVar4 = 0x1e9;
    goto LAB_0013372b;
  }
  authentication_handle->authorization_module = (IOTHUB_AUTHORIZATION_HANDLE)0x0;
  authentication_handle->cbs_put_token_async_context = (ASYNC_OPERATION_HANDLE)0x0;
  authentication_handle->is_cbs_put_token_in_progress = false;
  authentication_handle->is_sas_token_refresh_in_progress = false;
  *(undefined6 *)&authentication_handle->field_0x52 = 0;
  authentication_handle->current_sas_token_put_time = 0;
  *(undefined8 *)&authentication_handle->state = 0;
  authentication_handle->cbs_handle = (CBS_HANDLE)0x0;
  authentication_handle->on_error_callback_context = (void *)0x0;
  authentication_handle->cbs_request_timeout_secs = 0;
  authentication_handle->on_state_changed_callback_context = (void *)0x0;
  authentication_handle->on_error_callback = (ON_AUTHENTICATION_ERROR_CALLBACK)0x0;
  authentication_handle->iothub_host_fqdn = (STRING_HANDLE)0x0;
  authentication_handle->on_state_changed_callback = (ON_AUTHENTICATION_STATE_CHANGED_CALLBACK)0x0;
  authentication_handle->device_id = (char *)0x0;
  authentication_handle->module_id = (char *)0x0;
  pcVar1 = IoTHubClient_Auth_Get_DeviceId(handle);
  authentication_handle->device_id = pcVar1;
  if (pcVar1 == (char *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
LAB_0013379d:
      pAVar5 = (AUTHENTICATION_HANDLE)0x0;
      goto LAB_0013379f;
    }
    pcVar1 = 
    "authentication_create failed (config->device_id could not be copied; STRING_construct failed)";
    iVar4 = 0x1f2;
  }
  else {
    pSVar2 = STRING_construct(config->iothub_host_fqdn);
    authentication_handle->iothub_host_fqdn = pSVar2;
    if (pSVar2 != (STRING_HANDLE)0x0) {
      authentication_handle->state = AUTHENTICATION_STATE_STOPPED;
      pcVar1 = IoTHubClient_Auth_Get_ModuleId(config->authorization_module);
      authentication_handle->module_id = pcVar1;
      authentication_handle->on_state_changed_callback = config->on_state_changed_callback;
      authentication_handle->on_state_changed_callback_context =
           config->on_state_changed_callback_context;
      authentication_handle->on_error_callback = config->on_error_callback;
      authentication_handle->on_error_callback_context = config->on_error_callback_context;
      authentication_handle->cbs_request_timeout_secs = 0xffffffff;
      authentication_handle->authorization_module = config->authorization_module;
      pAVar5 = authentication_handle;
      goto LAB_0013379f;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0013379d;
    pcVar1 = 
    "authentication_create failed (config->iothub_host_fqdn could not be copied; STRING_construct failed)"
    ;
    iVar4 = 0x1f7;
  }
  pAVar5 = (AUTHENTICATION_HANDLE)0x0;
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
            ,"authentication_create",iVar4,1,pcVar1);
LAB_0013379f:
  if (pAVar5 == (AUTHENTICATION_HANDLE)0x0) {
    authentication_destroy(authentication_handle);
    return (AUTHENTICATION_HANDLE)0x0;
  }
  return pAVar5;
}

Assistant:

AUTHENTICATION_HANDLE authentication_create(const AUTHENTICATION_CONFIG* config)
{
    AUTHENTICATION_HANDLE result;

    if (config == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config is NULL)");
    }
    else if (config->authorization_module == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config->authorization_module is NULL)");
    }
    else if (config->iothub_host_fqdn == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config->iothub_host_fqdn is NULL)");
    }
    else if (config->on_state_changed_callback == NULL)
    {
        result = NULL;
        LogError("authentication_create failed (config->on_state_changed_callback is NULL)");
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance;

        if ((instance = (AUTHENTICATION_INSTANCE*)malloc(sizeof(AUTHENTICATION_INSTANCE))) == NULL)
        {
            result = NULL;
            LogError("authentication_create failed (malloc failed)");
        }
        else
        {
            memset(instance, 0, sizeof(AUTHENTICATION_INSTANCE));

            if ((instance->device_id = IoTHubClient_Auth_Get_DeviceId(config->authorization_module) ) == NULL)
            {
                result = NULL;
                LogError("authentication_create failed (config->device_id could not be copied; STRING_construct failed)");
            }
            else if ((instance->iothub_host_fqdn = STRING_construct(config->iothub_host_fqdn)) == NULL)
            {
                result = NULL;
                LogError("authentication_create failed (config->iothub_host_fqdn could not be copied; STRING_construct failed)");
            }
            else
            {
                instance->state = AUTHENTICATION_STATE_STOPPED;

                instance->module_id = IoTHubClient_Auth_Get_ModuleId(config->authorization_module);

                instance->on_state_changed_callback = config->on_state_changed_callback;
                instance->on_state_changed_callback_context = config->on_state_changed_callback_context;

                instance->on_error_callback = config->on_error_callback;
                instance->on_error_callback_context = config->on_error_callback_context;

                instance->cbs_request_timeout_secs = DEFAULT_CBS_REQUEST_TIMEOUT_SECS;

                instance->authorization_module = config->authorization_module;

                result = (AUTHENTICATION_HANDLE)instance;
            }

            if (result == NULL)
            {
                authentication_destroy((AUTHENTICATION_HANDLE)instance);
            }
        }
    }

    return result;
}